

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::ItemSize(ImVec2 *size,float text_baseline_y)

{
  float fVar1;
  float fVar2;
  ImGuiWindow *pIVar3;
  ImGuiContext *pIVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  pIVar4 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  if (pIVar3->SkipItems == false) {
    fVar6 = 0.0;
    fVar1 = (pIVar3->DC).CurrLineTextBaseOffset;
    if (0.0 <= text_baseline_y) {
      fVar6 = (float)(~-(uint)(fVar1 - text_baseline_y <= 0.0) & (uint)(fVar1 - text_baseline_y));
    }
    fVar8 = *(float *)((pIVar3->DC).MenuColumns.Widths + (ulong)(pIVar3->DC).IsSameLine * 4 + -0x3d)
    ;
    fVar7 = (pIVar3->DC).CurrLineSize.y;
    fVar6 = ((pIVar3->DC).CursorPos.y - fVar8) + size->y + fVar6;
    uVar5 = -(uint)(fVar6 <= fVar7);
    fVar2 = (pIVar3->Pos).x;
    fVar9 = (pIVar3->DC).CursorPos.x + size->x;
    (pIVar3->DC).CursorPosPrevLine.x = fVar9;
    (pIVar3->DC).CursorPosPrevLine.y = fVar8;
    fVar7 = (float)(uVar5 & (uint)fVar7 | ~uVar5 & (uint)fVar6);
    (pIVar3->DC).CursorPos.x =
         (float)(int)(fVar2 + (pIVar3->DC).Indent.x + (pIVar3->DC).ColumnsOffset.x);
    fVar8 = (float)(int)(fVar7 + fVar8 + (pIVar4->Style).ItemSpacing.y);
    (pIVar3->DC).CursorPos.y = fVar8;
    fVar6 = (pIVar3->DC).CursorMaxPos.x;
    uVar5 = -(uint)(fVar9 <= fVar6);
    (pIVar3->DC).CursorMaxPos.x = (float)(uVar5 & (uint)fVar6 | ~uVar5 & (uint)fVar9);
    fVar6 = (pIVar3->DC).CursorMaxPos.y;
    fVar8 = fVar8 - (pIVar4->Style).ItemSpacing.y;
    uVar5 = -(uint)(fVar8 <= fVar6);
    (pIVar3->DC).CursorMaxPos.y = (float)(uVar5 & (uint)fVar6 | ~uVar5 & (uint)fVar8);
    (pIVar3->DC).PrevLineSize.y = fVar7;
    (pIVar3->DC).CurrLineSize.y = 0.0;
    (pIVar3->DC).PrevLineTextBaseOffset =
         (float)(~-(uint)(text_baseline_y <= fVar1) & (uint)text_baseline_y |
                (uint)fVar1 & -(uint)(text_baseline_y <= fVar1));
    (pIVar3->DC).CurrLineTextBaseOffset = 0.0;
    (pIVar3->DC).IsSameLine = false;
    (pIVar3->DC).IsSetPos = false;
    if (((pIVar3->DC).LayoutType == 0) &&
       (pIVar3 = pIVar4->CurrentWindow, pIVar3->SkipItems == false)) {
      (pIVar3->DC).CursorPos.x = (pIVar4->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x;
      (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
      (pIVar3->DC).CurrLineSize = (pIVar3->DC).PrevLineSize;
      (pIVar3->DC).CurrLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
      (pIVar3->DC).IsSameLine = true;
      return;
    }
  }
  return;
}

Assistant:

void ImGui::ItemSize(const ImVec2& size, float text_baseline_y)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    // We increase the height in this function to accommodate for baseline offset.
    // In theory we should be offsetting the starting position (window->DC.CursorPos), that will be the topic of a larger refactor,
    // but since ItemSize() is not yet an API that moves the cursor (to handle e.g. wrapping) enlarging the height has the same effect.
    const float offset_to_match_baseline_y = (text_baseline_y >= 0) ? ImMax(0.0f, window->DC.CurrLineTextBaseOffset - text_baseline_y) : 0.0f;

    const float line_y1 = window->DC.IsSameLine ? window->DC.CursorPosPrevLine.y : window->DC.CursorPos.y;
    const float line_height = ImMax(window->DC.CurrLineSize.y, /*ImMax(*/window->DC.CursorPos.y - line_y1/*, 0.0f)*/ + size.y + offset_to_match_baseline_y);

    // Always align ourselves on pixel boundaries
    //if (g.IO.KeyAlt) window->DrawList->AddRect(window->DC.CursorPos, window->DC.CursorPos + ImVec2(size.x, line_height), IM_COL32(255,0,0,200)); // [DEBUG]
    window->DC.CursorPosPrevLine.x = window->DC.CursorPos.x + size.x;
    window->DC.CursorPosPrevLine.y = line_y1;
    window->DC.CursorPos.x = IM_FLOOR(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);    // Next line
    window->DC.CursorPos.y = IM_FLOOR(line_y1 + line_height + g.Style.ItemSpacing.y);                    // Next line
    window->DC.CursorMaxPos.x = ImMax(window->DC.CursorMaxPos.x, window->DC.CursorPosPrevLine.x);
    window->DC.CursorMaxPos.y = ImMax(window->DC.CursorMaxPos.y, window->DC.CursorPos.y - g.Style.ItemSpacing.y);
    //if (g.IO.KeyAlt) window->DrawList->AddCircle(window->DC.CursorMaxPos, 3.0f, IM_COL32(255,0,0,255), 4); // [DEBUG]

    window->DC.PrevLineSize.y = line_height;
    window->DC.CurrLineSize.y = 0.0f;
    window->DC.PrevLineTextBaseOffset = ImMax(window->DC.CurrLineTextBaseOffset, text_baseline_y);
    window->DC.CurrLineTextBaseOffset = 0.0f;
    window->DC.IsSameLine = window->DC.IsSetPos = false;

    // Horizontal layout mode
    if (window->DC.LayoutType == ImGuiLayoutType_Horizontal)
        SameLine();
}